

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::addSatSI8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  byte bVar1;
  byte bVar2;
  int32_t iVar3;
  int32_t iVar4;
  byte bVar5;
  
  iVar3 = geti32(this);
  iVar4 = geti32(other);
  bVar1 = (byte)iVar3;
  bVar5 = (byte)iVar4 + bVar1;
  bVar2 = 0x7f - ((char)bVar1 >> 7);
  if (-1 < (char)((bVar5 ^ bVar1) & ((byte)iVar4 ^ bVar5))) {
    bVar2 = bVar5;
  }
  *(int *)&__return_storage_ptr__->field_0 = (int)(char)bVar2;
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::addSatSI8(const Literal& other) const {
  return Literal(add_sat_s<int8_t>(geti32(), other.geti32()));
}